

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::dictDelete(dic *this,int dictidx,void *key)

{
  string *psVar1;
  reference pvVar2;
  undefined8 *puVar3;
  string *this_00;
  void *pvVar4;
  dictEntry *delEntry;
  void *key_local;
  int dictidx_local;
  dic *this_local;
  
  pvVar2 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  if (pvVar2->rehashidx == -1) {
    puVar3 = (undefined8 *)dict_find(this,dictidx,0,key);
    if (puVar3 != (undefined8 *)0x0) {
      psVar1 = (string *)*puVar3;
      if (psVar1 != (string *)0x0) {
        std::__cxx11::string::~string(psVar1);
        operator_delete(psVar1);
      }
      *puVar3 = 0;
      if (*(int *)puVar3[1] == 0) {
        psVar1 = (string *)puVar3[1];
        if (psVar1 != (string *)0x0) {
          std::__cxx11::string::~string(psVar1);
          operator_delete(psVar1);
        }
      }
      else if (*(int *)puVar3[1] == 2) {
        psVar1 = (string *)puVar3[1];
        if (psVar1 != (string *)0x0) {
          this_00 = psVar1 + *(long *)(psVar1 + -8) * 0x20;
          while (psVar1 != this_00) {
            this_00 = this_00 + -0x20;
            std::__cxx11::string::~string(this_00);
          }
          operator_delete__(psVar1 + -8);
        }
      }
      else if (*(int *)puVar3[1] == 1) {
        rlist::listDel((rlist *)puVar3[1]);
      }
      puVar3[1] = 0;
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3);
      }
      return 1;
    }
  }
  else {
    pvVar4 = dict_find(this,dictidx,0,key);
    if (pvVar4 != (void *)0x0) {
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      return 1;
    }
    pvVar4 = dict_find(this,dictidx,1,key);
    if ((pvVar4 != (void *)0x0) && (pvVar4 != (void *)0x0)) {
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      return 1;
    }
  }
  return -1;
}

Assistant:

int dic::dictDelete(int dictidx,void *key){
    dictEntry *delEntry=NULL;
    if(dc[dictidx].rehashidx==-1){
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete (std::string *)delEntry->key;
            delEntry->key=NULL;
            if(((robj *)delEntry->v.val)->objtype==_string)
            {
                delete (std::string *)delEntry->v.val;
            }else if(((robj *)delEntry->v.val)->objtype==_set){
                delete[] (std::string *)delEntry->v.val; 
            }else if(((robj *)delEntry->v.val)->objtype==_list){
                ((rlist *)delEntry->v.val)->listDel();
            }
            delEntry->v.val=NULL;
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
    }else {
        delEntry=(dictEntry *)dic::dict_find(dictidx,0,key);
        if(delEntry!=NULL){
            delete delEntry;
            delEntry=NULL;
            return 1;
        }
        else if((delEntry=(dictEntry *)dic::dict_find(dictidx,1,key))!=NULL){
            if(delEntry!=NULL){
                delete delEntry;
                delEntry=NULL;
                return 1;
            } 
        }  
    }
    return -1;
}